

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.h
# Opt level: O2

void __thiscall LTChannel::LTChannel(LTChannel *this,dataRefsLT ch,LTChannelType t,char *chName)

{
  this->_vptr_LTChannel = (_func_int **)&PTR__LTChannel_002bb9a8;
  (this->urlLink)._M_dataplus._M_p = (pointer)&(this->urlLink).field_2;
  (this->urlLink)._M_string_length = 0;
  (this->urlLink).field_2._M_local_buf[0] = '\0';
  (this->urlName)._M_dataplus._M_p = (pointer)&(this->urlName).field_2;
  (this->urlName)._M_string_length = 0;
  (this->urlName).field_2._M_local_buf[0] = '\0';
  (this->urlPopup)._M_dataplus._M_p = (pointer)&(this->urlPopup).field_2;
  (this->urlPopup)._M_string_length = 0;
  (this->urlPopup).field_2._M_local_buf[0] = '\0';
  this->pszChName = chName;
  this->channel = ch;
  this->eType = t;
  (this->thr)._M_id._M_thread = 0;
  (this->tNextWakeup).__d.__r = 0;
  this->eThrStatus = THR_NONE;
  this->bValid = true;
  this->errCnt = 0;
  return;
}

Assistant:

LTChannel (dataRefsLT ch, LTChannelType t, const char* chName) :
        pszChName(chName), eType(t), channel(ch) {}